

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

string * __thiscall
cfd::core::KeyData::ToString_abi_cxx11_
          (string *__return_storage_ptr__,KeyData *this,bool has_pubkey,HardenedType hardened_type,
          bool has_hex)

{
  bool bVar1;
  ostream *poVar2;
  string path_str;
  stringstream ss;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  GetBip32Path_abi_cxx11_(&local_1d0,this,hardened_type,has_hex);
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  if (local_1d0._M_string_length != 0) {
    bVar1 = ByteData::IsEmpty(&this->fingerprint_);
    if (!bVar1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"[",1);
      ByteData::GetHex_abi_cxx11_(&local_1f0,&this->fingerprint_);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (has_pubkey) {
    Pubkey::GetHex_abi_cxx11_(&local_1f0,&this->pubkey_);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  }
  else {
    bVar1 = Privkey::IsValid(&(this->extprivkey_).super_Extkey.privkey_);
    if (bVar1) {
      Extkey::ToString_abi_cxx11_(&local_1f0,&(this->extprivkey_).super_Extkey);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    }
    else {
      bVar1 = Pubkey::IsValid(&(this->extpubkey_).super_Extkey.pubkey_);
      if (bVar1) {
        Extkey::ToString_abi_cxx11_(&local_1f0,&(this->extpubkey_).super_Extkey);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      }
      else {
        bVar1 = Privkey::IsValid(&this->privkey_);
        if (bVar1) {
          Privkey::GetWif_abi_cxx11_(&local_1f0,&this->privkey_);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        }
        else {
          Pubkey::GetHex_abi_cxx11_(&local_1f0,&this->pubkey_);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string KeyData::ToString(
    bool has_pubkey, HardenedType hardened_type, bool has_hex) const {
  auto path_str = GetBip32Path(hardened_type, has_hex);
  std::stringstream ss;
  if ((!path_str.empty()) && (!fingerprint_.IsEmpty())) {
    ss << "[" << fingerprint_.GetHex() << "/" << path_str << "]";
  }
  if (has_pubkey) {
    ss << pubkey_.GetHex();
  } else if (extprivkey_.IsValid()) {
    ss << extprivkey_.ToString();
  } else if (extpubkey_.IsValid()) {
    ss << extpubkey_.ToString();
  } else if (privkey_.IsValid()) {
    ss << privkey_.GetWif();
  } else {
    ss << pubkey_.GetHex();
  }
  return ss.str();
}